

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

group * clipp::operator&(parameter *a,parameter *b)

{
  token<clipp::parameter> *in_RDX;
  group *in_RSI;
  parameter *in_RDI;
  parameter *this;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar1;
  parameter *params;
  parameter *param;
  group *in_stack_fffffffffffffd90;
  parameter local_260;
  parameter local_160;
  group local_60;
  
  uVar1 = 1;
  this = in_RDI;
  detail::token<clipp::parameter>::blocking((token<clipp::parameter> *)in_RSI,true);
  detail::token<clipp::parameter>::blocking(in_RDX,SUB41(uVar1,0));
  params = &local_160;
  parameter::parameter(this,in_RDI);
  param = &local_260;
  parameter::parameter(this,in_RDI);
  group::group<clipp::parameter>(in_stack_fffffffffffffd90,param,params);
  group::scoped(&local_60,true);
  group::group(in_RSI,(group *)CONCAT44(uVar1,in_stack_fffffffffffffd68));
  group::~group((group *)this);
  parameter::~parameter(this);
  parameter::~parameter(this);
  return (group *)this;
}

Assistant:

inline group
operator & (parameter a, parameter b)
{
    a.blocking(true);
    b.blocking(true);
    return group{std::move(a), std::move(b)}.scoped(true);
}